

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_align.c
# Opt level: O0

void write_phseg(char *dir,align_phseg_t *phseg,char *uttid,char *ctlspec)

{
  uint local_434;
  FILE *pFStack_430;
  int32 uttscr;
  FILE *fp;
  char str [1024];
  char *ctlspec_local;
  char *uttid_local;
  align_phseg_t *phseg_local;
  char *dir_local;
  
  str._1016_8_ = ctlspec;
  build_output_uttfile((char *)&fp,dir,uttid,ctlspec);
  strcat((char *)&fp,".phseg");
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
          ,499,"Writing phone segmentation to: %s\n",&fp);
  pFStack_430 = fopen((char *)&fp,"w");
  phseg_local = (align_phseg_t *)dir;
  if (pFStack_430 == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
                   ,0x1f5,"Failed to open file %s for writing",&fp);
    pFStack_430 = _stdout;
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/main_align.c"
            ,0x1f7,"Phone segmentation (%s):\n",uttid);
    phseg_local = (align_phseg_t *)0x0;
  }
  if (phseg_local == (align_phseg_t *)0x0) {
    fprintf(pFStack_430,"PH:%s>",uttid);
    fflush(pFStack_430);
  }
  fprintf(pFStack_430,"\t%5s %5s %9s %s\n","SFrm","EFrm","SegAScr","Phone");
  fflush(pFStack_430);
  local_434 = 0;
  for (uttid_local = (char *)phseg; uttid_local != (char *)0x0;
      uttid_local = *(char **)(uttid_local + 0x10)) {
    mdef_phone_str(kbc->mdef,*(s3pid_t *)uttid_local,(char *)&fp);
    if (phseg_local == (align_phseg_t *)0x0) {
      fprintf(pFStack_430,"ph:%s>",uttid);
      fflush(pFStack_430);
    }
    fprintf(pFStack_430,"\t%5d %5d %9d %s\n",(ulong)(uint)(int)*(short *)(uttid_local + 4),
            (ulong)(uint)(int)*(short *)(uttid_local + 6),(ulong)*(uint *)(uttid_local + 8),&fp);
    fflush(pFStack_430);
    local_434 = *(int *)(uttid_local + 8) + local_434;
  }
  if (phseg_local == (align_phseg_t *)0x0) {
    fprintf(pFStack_430,"PH:%s>",uttid);
    fflush(pFStack_430);
  }
  fprintf(pFStack_430," Total score: %11d\n",(ulong)local_434);
  fflush(pFStack_430);
  if (phseg_local == (align_phseg_t *)0x0) {
    fprintf(pFStack_430,"\n");
    fflush(pFStack_430);
  }
  else {
    fclose(pFStack_430);
  }
  return;
}

Assistant:

static void
write_phseg(char *dir, align_phseg_t * phseg, char *uttid, char *ctlspec)
{
    char str[1024];
    FILE *fp;
    int32 uttscr;

    /* Attempt to write segmentation for this utt to a separate file */
    build_output_uttfile(str, dir, uttid, ctlspec);
    strcat(str, ".phseg");
    E_INFO("Writing phone segmentation to: %s\n", str);
    if ((fp = fopen(str, "w")) == NULL) {
        E_ERROR_SYSTEM("Failed to open file %s for writing", str);
        fp = stdout;            /* Segmentations can be directed to stdout this way */
        E_INFO("Phone segmentation (%s):\n", uttid);
        dir = NULL;             /* Flag to indicate fp shouldn't be closed at the end */
    }

    if (!dir) {
        fprintf(fp, "PH:%s>", uttid);
        fflush(fp);
    }
    fprintf(fp, "\t%5s %5s %9s %s\n", "SFrm", "EFrm", "SegAScr", "Phone");
    fflush(fp);
    uttscr = 0;
    for (; phseg; phseg = phseg->next) {
        mdef_phone_str(kbc->mdef, phseg->pid, str);

        if (!dir) {
            fprintf(fp, "ph:%s>", uttid);
            fflush(fp);
        }
        fprintf(fp, "\t%5d %5d %9d %s\n",
                phseg->sf, phseg->ef, phseg->score, str);
        fflush(fp);
        uttscr += (phseg->score);
    }

    if (!dir) {
        fprintf(fp, "PH:%s>", uttid);
        fflush(fp);
    }
    fprintf(fp, " Total score: %11d\n", uttscr);
    fflush(fp);

    if (dir)
        fclose(fp);
    else {
        fprintf(fp, "\n");
        fflush(fp);
    }
}